

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O3

String * __thiscall
glcts::UniformBlocksLayoutBindingCase::buildAccess
          (String *__return_storage_ptr__,UniformBlocksLayoutBindingCase *this,String *var)

{
  ostream *poVar1;
  ostringstream s;
  undefined1 local_190 [376];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"vec4(0.0, ",10);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_190,(var->_M_dataplus)._M_p,var->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"_a, 0.0, 1.0) + vec4(0.0, ",0x1a);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(var->_M_dataplus)._M_p,var->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"_b, 0.0, 1.0)",0xd);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  std::ios_base::~ios_base((ios_base *)(local_190 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

String buildAccess(const String& var)
	{
		std::ostringstream s;
		s << "vec4(0.0, " << var << "_a, 0.0, 1.0) + vec4(0.0, " << var << "_b, 0.0, 1.0)";
		return s.str();
	}